

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::emit_shufflevector_instruction(Impl *impl,ShuffleVectorInst *inst)

{
  Id arg;
  uint32_t lit;
  Operation *op;
  Value *value;
  Type *this;
  uint i;
  uint uVar1;
  uint i_1;
  uint index;
  
  op = Converter::Impl::allocate(impl,OpVectorShuffle,(Value *)inst);
  for (uVar1 = 0; uVar1 != 2; uVar1 = uVar1 + 1) {
    value = LLVMBC::Instruction::getOperand(&inst->super_Instruction,uVar1);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(op,arg);
  }
  this = LLVMBC::Value::getType((Value *)inst);
  uVar1 = LLVMBC::Type::getVectorNumElements(this);
  for (index = 0; uVar1 != index; index = index + 1) {
    lit = LLVMBC::ShuffleVectorInst::getMaskValue(inst,index);
    Operation::add_literal(op,lit);
  }
  Converter::Impl::add(impl,op,false);
  return true;
}

Assistant:

bool emit_shufflevector_instruction(Converter::Impl &impl, const llvm::ShuffleVectorInst *inst)
{
	Operation *op = impl.allocate(spv::OpVectorShuffle, inst);

	for (unsigned i = 0; i < 2; i++)
		op->add_id(impl.get_id_for_value(inst->getOperand(i)));

	unsigned num_outputs = inst->getType()->getVectorNumElements();
	for (unsigned i = 0; i < num_outputs; i++)
		op->add_literal(inst->getMaskValue(i));

	impl.add(op);
	return true;
}